

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_4::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  uint8_t uVar1;
  string *psVar2;
  Options *in_RCX;
  FieldOptions *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  char *value;
  AlphaNum *in_R8;
  long lVar3;
  bool bVar4;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  string lazy_var;
  string trivial_default;
  allocator_type local_b09;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  undefined1 local_908 [32];
  string local_8e8;
  string local_8c8;
  string local_8a8;
  undefined1 local_888 [48];
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_858;
  undefined1 local_850 [56];
  char *local_818;
  undefined1 local_7f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  local_7d0;
  HeapOrSoo local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  undefined1 local_780 [72];
  AlphaNum local_738;
  FieldOptions *local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_700;
  undefined1 auStack_6f0 [24];
  AlphaNum local_6d8;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  if (opts->experimental_use_micro_string == true) {
    local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"::absl::string_view()","")
    ;
    field_01 = extraout_RDX;
  }
  else {
    local_6a8.key_._M_dataplus._M_p = (pointer)0x2;
    local_6a8.key_._M_string_length = 0x133783f;
    bVar4 = opts->opensource_runtime != false;
    local_7f0._0_8_ = &DAT_00000006;
    if (bVar4) {
      local_7f0._0_8_ = &DAT_00000010;
    }
    local_7f0._8_8_ = "proto2";
    if (bVar4) {
      local_7f0._8_8_ = "google::protobuf";
    }
    in_RCX = (Options *)local_850;
    local_850._0_8_ = (FieldOptions *)0x29;
    local_850._8_8_ = "::internal::GetEmptyStringAlreadyInited()";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_ac8,(lts_20250127 *)&local_6a8,(AlphaNum *)local_7f0,(AlphaNum *)in_RCX,in_R8)
    ;
    field_01 = extraout_RDX_00;
  }
  bVar4 = opts->experimental_use_micro_string;
  if (bVar4 == true) {
    local_6a8.key_._M_dataplus._M_p = &DAT_00000007;
    local_6a8.key_._M_string_length = 0x1337998;
    MakeDefaultFieldName_abi_cxx11_(&local_b08,(cpp *)field,field_01);
    local_7f0._0_8_ = local_b08._M_string_length;
    local_7f0._8_8_ = local_b08._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_ae8,(lts_20250127 *)&local_6a8,(AlphaNum *)local_7f0,
               (AlphaNum *)local_b08._M_string_length);
    field_00 = (FieldOptions *)local_b08._M_string_length;
  }
  else {
    QualifiedClassName_abi_cxx11_
              (&local_b08,(cpp *)field->containing_type_,(Descriptor *)opts,in_RCX);
    local_850._0_8_ = local_b08._M_string_length;
    local_850._8_8_ = local_b08._M_dataplus._M_p;
    local_850._48_8_ = (pointer)0x2;
    local_818 = "::";
    MakeDefaultFieldName_abi_cxx11_((string *)local_908,(cpp *)field,field_02);
    field_00 = (FieldOptions *)local_888;
    local_888._0_8_ = local_908._8_8_;
    local_888._8_8_ = local_908._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_ae8,(lts_20250127 *)local_850,(AlphaNum *)(local_850 + 0x30),
               (AlphaNum *)field_00,in_R8);
  }
  if (bVar4 == false) {
    if ((AlphaNum *)local_908._0_8_ != (AlphaNum *)(local_908 + 0x10)) {
      operator_delete((void *)local_908._0_8_,local_908._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
      operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
    }
  }
  if ((bVar4 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2)) {
    operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
  }
  psVar2 = ((field->field_20).default_value_enum_)->all_names_;
  uVar1 = field->type_;
  local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"kDefault","");
  DefaultValue_abi_cxx11_(&local_8a8,(cpp *)opts,(Options *)field,(FieldDescriptor *)field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_6a8,&local_9e8,&local_8a8);
  local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"kDefaultLen","");
  local_858 = (anon_union_8_2_3066aaf9_for_type_descriptor_)
              ((field->field_20).default_value_enum_)->all_names_;
  io::Printer::Sub::Sub<unsigned_long>(&local_5f0,&local_a08,(unsigned_long *)&local_858);
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"default_variable_name","");
  local_7f0._0_8_ = &DAT_0000002e;
  local_7f0._8_8_ = "_i_give_permission_to_break_this_code_default_";
  FieldName_abi_cxx11_((string *)local_888,(cpp *)field,field_03);
  local_850._0_8_ = local_888._8_8_;
  local_850._8_8_ = local_888._0_8_;
  local_850._48_8_ = (pointer)0x1;
  local_818 = "_";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_8c8,(lts_20250127 *)local_7f0,(AlphaNum *)local_850,
             (AlphaNum *)(local_850 + 0x30),in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_888 + 0x10)) {
    operator_delete((void *)local_888._0_8_,(ulong)(local_888._16_8_ + 1));
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_538,&local_a28,&local_8c8);
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"default_variable_field","");
  MakeDefaultFieldName_abi_cxx11_(&local_8e8,(cpp *)field,field_04);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_480,&local_a48,&local_8e8);
  local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a68,"kDefaultStr","");
  if (psVar2 == (string *)0x0) {
    local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_988,local_ac8._M_dataplus._M_p,
               local_ac8._M_dataplus._M_p +
               (long)((char *)(local_ac8._M_string_length + 0x10) + -0x10));
  }
  else {
    local_850._0_8_ = local_ae8._M_string_length;
    local_850._8_8_ = local_ae8._M_dataplus._M_p;
    local_850._48_8_ = &DAT_00000006;
    local_818 = ".get()";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_988,(lts_20250127 *)local_850,(AlphaNum *)(local_850 + 0x30),
               (AlphaNum *)local_ae8._M_string_length);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_a68,&local_988);
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"kDefaultValue","");
  if (psVar2 == (string *)0x0) {
    local_888._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    local_888._8_8_ = "&";
    local_6d8.piece_._M_len = local_ac8._M_string_length;
    local_6d8.piece_._M_str = local_ac8._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_9a8,(lts_20250127 *)local_888,&local_6d8,
               (AlphaNum *)local_ac8._M_string_length);
  }
  else {
    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"nullptr","");
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_a88,&local_9a8);
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa8,"lazy_var","");
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_258,&local_aa8,&local_ae8);
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"lazy_args","");
  if (psVar2 == (string *)0x0) {
    local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,anon_var_dwarf_a12c75 + 5);
  }
  else {
    local_708 = (FieldOptions *)local_ae8._M_string_length;
    local_700 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ae8._M_dataplus._M_p;
    local_738.piece_._M_len = 1;
    local_738.piece_._M_str = ",";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_9c8,(lts_20250127 *)&local_708,&local_738,
               (AlphaNum *)local_ae8._M_string_length);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_7f0,&local_928,&local_9c8);
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,",","");
  io::Printer::Sub::WithSuffix(&local_1a0,(Sub *)local_7f0,&local_948);
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"byte","");
  value = "char";
  if (uVar1 == '\f') {
    value = "void";
  }
  io::Printer::Sub::Sub<char_const(&)[5]>(&local_e8,&local_968,(char (*) [5])value);
  __l._M_len = 9;
  __l._M_array = &local_6a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_b09);
  lVar3 = 0x678;
  do {
    if (local_6d8.digits_[lVar3 + 0x18] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_6f0 + lVar3));
    }
    if ((long *)((long)&local_708 + lVar3) != *(long **)(local_738.digits_ + lVar3 + 0x10)) {
      operator_delete(*(long **)(local_738.digits_ + lVar3 + 0x10),
                      *(long *)((long)&local_708 + lVar3) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_738.digits_[lVar3 + 8]]._M_data)
              ((anon_class_1_0_00000001 *)&local_b09,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_780 + lVar3 + 0x40));
    local_738.digits_[lVar3 + 8] = -1;
    if ((long *)(local_780 + lVar3 + 0x30) != *(long **)(local_780 + lVar3 + 0x20)) {
      operator_delete(*(long **)(local_780 + lVar3 + 0x20),*(long *)(local_780 + lVar3 + 0x30) + 1);
    }
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if (local_780[0x40] == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)local_780)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8.heap.control != &local_798) {
    operator_delete(local_7a8.heap.control,local_798._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_7d0.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)((anon_class_1_0_00000001 *)&local_b09,&local_7d0);
  local_7d0.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._0_8_ != &local_7e0) {
    operator_delete((void *)local_7f0._0_8_,(ulong)(local_7e0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& opts) {
  auto trivial_default =
      opts.experimental_use_micro_string
          ? "::absl::string_view()"
          : absl::StrCat("::", ProtobufNamespace(opts),
                         "::internal::GetEmptyStringAlreadyInited()");
  auto lazy_var =
      opts.experimental_use_micro_string
          ? absl::StrCat("Impl_::", MakeDefaultFieldName(field))
          : absl::StrCat(QualifiedClassName(field->containing_type(), opts),
                         "::", MakeDefaultFieldName(field));

  bool empty_default = field->default_value_string().empty();
  bool bytes = field->type() == FieldDescriptor::TYPE_BYTES;

  return {
      {"kDefault", DefaultValue(opts, field)},
      {"kDefaultLen", field->default_value_string().size()},
      {"default_variable_name", MakeDefaultName(field)},
      {"default_variable_field", MakeDefaultFieldName(field)},

      {"kDefaultStr",
       !empty_default ? absl::StrCat(lazy_var, ".get()") : trivial_default},
      {"kDefaultValue",
       !empty_default ? "nullptr" : absl::StrCat("&", trivial_default)},

      {"lazy_var", lazy_var},
      Sub{"lazy_args", !empty_default ? absl::StrCat(lazy_var, ",") : ""}
          .WithSuffix(","),

      {"byte", bytes ? "void" : "char"},
  };
}